

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::EventLoop::LocalMap>::disposeImpl
          (HeapDisposer<kj::EventLoop::LocalMap> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Table<kj::HashMap<const_void_*,_kj::Own<void,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<const_void_*,_kj::Own<void,_std::nullptr_t>_>::Callbacks>_>
    ::~Table((Table<kj::HashMap<const_void_*,_kj::Own<void,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<const_void_*,_kj::Own<void,_std::nullptr_t>_>::Callbacks>_>
              *)pointer);
  }
  operator_delete(pointer,0x48);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }